

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::list_cs_ext::front(list *lst)

{
  bool bVar1;
  string *str;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  proxy *in_RDI;
  any *in_stack_ffffffffffffff98;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffffa0;
  allocator *this;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::empty(in_RSI);
  if (!bVar1) {
    std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::front
              (in_stack_ffffffffffffffa0);
    any::any((any *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    return (var)in_RDI;
  }
  str = (string *)__cxa_allocate_exception(0x20);
  this = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Call front() on empty list.",this);
  cs::lang_error::lang_error((lang_error *)this,str);
  __cxa_throw(str,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

var front(const list &lst)
		{
			if (lst.empty())
				throw lang_error("Call front() on empty list.");
			return lst.front();
		}